

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_floor(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp_tag_t sVar1;
  sexp psVar2;
  double f;
  
  if (((ulong)z & 3) == 0) {
    sVar1 = z->tag;
    if (sVar1 == 0xb) {
      f = floor((z->value).flonum);
      psVar2 = sexp_make_flonum(ctx,f);
      return psVar2;
    }
    if (sVar1 == 0xc) {
      return z;
    }
    if (sVar1 == 0xd) {
      psVar2 = sexp_ratio_floor(ctx,z);
      return psVar2;
    }
  }
  else if (((ulong)z & 1) != 0) {
    return z;
  }
  psVar2 = sexp_type_exception(ctx,self,3,z);
  return psVar2;
}

Assistant:

sexp sexp_log (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  double d;
#if SEXP_USE_COMPLEX
  sexp_gc_var1(tmp);
  if (sexp_complexp(z))
    return sexp_complex_log(ctx, z);
#endif
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z);
  maybe_convert_ratio(ctx, z)
  maybe_convert_bignum(z)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    sexp_gc_preserve1(ctx, tmp);
    tmp = sexp_make_flonum(ctx, d);
    tmp = sexp_make_complex(ctx, tmp, SEXP_ZERO);
    tmp = sexp_complex_log(ctx, tmp);
    sexp_gc_release1(ctx);
    return tmp;
  }
#endif
  return sexp_make_flonum(ctx, log(d));
}